

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAttributes.cpp
# Opt level: O2

void testAttributes(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  Iterator IVar2;
  Iterator IVar3;
  _Base_ptr p_Var4;
  _Alloc_hider __filename;
  bool bVar5;
  __type _Var6;
  uint uVar7;
  ostream *poVar8;
  char *pcVar9;
  Header *pHVar10;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *pTVar11;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *pTVar12;
  TypedAttribute<float> *pTVar13;
  TypedAttribute<int> *pTVar14;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar15;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar16;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar17;
  TypedAttribute<Imath_3_2::Vec2<int>_> *pTVar18;
  TypedAttribute<Imath_3_2::Vec2<float>_> *pTVar19;
  TypedAttribute<Imath_3_2::Vec3<int>_> *pTVar20;
  TypedAttribute<Imath_3_2::Vec3<float>_> *pTVar21;
  TypedAttribute<double> *pTVar22;
  TypedAttribute<Imf_3_4::Chromaticities> *pTVar23;
  TypedAttribute<Imf_3_4::Envmap> *pTVar24;
  TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pTVar25;
  TypedAttribute<Imath_3_2::Matrix33<double>_> *pTVar26;
  TypedAttribute<Imath_3_2::Matrix44<double>_> *pTVar27;
  TypedAttribute<Imath_3_2::Vec2<double>_> *pTVar28;
  TypedAttribute<Imath_3_2::Vec3<double>_> *pTVar29;
  TypedAttribute<Imf_3_4::DeepImageState> *pTVar30;
  TypedAttribute<std::vector<float,_std::allocator<float>_>_> *pTVar31;
  long *plVar32;
  OpaqueAttribute *pOVar33;
  char *pcVar34;
  iterator iVar35;
  _Rb_tree_node_base *p_Var36;
  _Rb_tree_node_base *p_Var37;
  float *pfVar38;
  ulong uVar39;
  Iterator tmp;
  ulong uVar40;
  int iVar41;
  int iVar42;
  _Self __tmp;
  long lVar43;
  undefined1 auVar44 [16];
  Iterator first;
  double dStack_450;
  _Base_ptr local_448;
  _Base_ptr p_Stack_440;
  _Base_ptr local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  OutputFile out;
  undefined3 uStack_407;
  undefined4 uStack_404;
  uint local_3e0;
  long local_3d0;
  Header hdr;
  Iterator last;
  DeepImageState a21;
  Envmap a14;
  int a4;
  float a3;
  ChannelList channels;
  TestOpaque a24;
  V3i a10;
  StringVector a15;
  double a12;
  V2i a8;
  FloatVector a23;
  Chromaticities a13;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  Array2D<float> pf;
  FloatVector a22;
  StringVector a20;
  Box<Imath_3_2::Vec2<float>_> local_d8;
  Box<Imath_3_2::Vec2<int>_> local_c8;
  string filename;
  string a7;
  FrameBuffer fb;
  Matrix33<float> local_48;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"Testing built-in attributes");
  std::endl<char,std::char_traits<char>>(poVar8);
  pf._sizeX = 0xc5;
  pf._sizeY = 0xd9;
  pf._data = (float *)operator_new__(0x29bf4);
  iVar41 = 0;
  pfVar38 = pf._data;
  for (uVar40 = 0; uVar40 != 0xc5; uVar40 = uVar40 + 1) {
    iVar42 = iVar41 + (int)((uVar40 & 0xffffffff) / 0x11) * -0xaa;
    uVar39 = 0;
    lVar43 = 0;
    while( true ) {
      if (lVar43 == 0x364) break;
      *(float *)((long)pfVar38 + lVar43) = (float)(iVar42 + (int)(uVar39 / 10) * -10);
      lVar43 = lVar43 + 4;
      iVar42 = iVar42 + 1;
      uVar39 = (ulong)((int)uVar39 + 1);
    }
    pfVar38 = pfVar38 + 0xd9;
    iVar41 = iVar41 + 10;
  }
  std::operator+(&filename,tempDir,"imf_test_attr.exr");
  __filename = filename._M_dataplus;
  Imf_3_4::TypedAttribute<Imf_3_4::TestOpaque>::registerAttributeType();
  local_c8.min.x = 1;
  local_c8.min.y = 2;
  local_c8.max.x = 3;
  local_c8.max.y = 4;
  local_d8.min.x = 1.5;
  local_d8.min.y = 2.5;
  local_d8.max.x = 3.5;
  local_d8.max.y = 4.5;
  local_48.x[0][0] = 11.0;
  local_48.x[0][1] = 12.0;
  local_48.x[0][2] = 13.0;
  local_48.x[1][0] = 14.0;
  local_48.x[1][1] = 15.0;
  local_48.x[1][2] = 16.0;
  local_48.x[2][0] = 17.0;
  local_48.x[2][1] = 18.0;
  local_48.x[2][2] = 19.0;
  last._i._M_node = (iterator)(_Base_ptr)0x400000003f800000;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a7,"extensive rebuilding by Nebuchadrezzar has left",(allocator<char> *)&out
            );
  _out = (pointer)0x400000003f800000;
  channels._map._M_t._M_impl._0_8_ = 0x4080000040400000;
  first._i._M_node = (iterator)(_Base_ptr)0x40c0000040a00000;
  _hdr = (_Base_ptr)0x4100000040e00000;
  Imf_3_4::Chromaticities::Chromaticities
            (&a13,(Vec2 *)&out,(Vec2 *)&channels,(Vec2 *)&first,(Vec2 *)&hdr);
  a15.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a15.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a15.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"who can spin",(allocator<char> *)&channels);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out,"",(allocator<char> *)&channels)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"straw into",(allocator<char> *)&channels);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"gold",(allocator<char> *)&channels);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  std::__cxx11::string::~string((string *)&out);
  first._i._M_node = (iterator)(_Base_ptr)0x4028000000000000;
  dStack_450 = 13.0;
  local_448 = (_Base_ptr)0x402c000000000000;
  p_Stack_440 = (_Base_ptr)0x402e000000000000;
  local_438 = (_Base_ptr)0x4030000000000000;
  dStack_430 = 17.0;
  local_428 = 18.0;
  dStack_420 = 19.0;
  local_418 = 20.0;
  channels._map._M_t._M_impl._0_8_ = 0x4000000000000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x40080000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x4010000000000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x4014000000000000
  ;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x4018000000000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x401c000000000000;
  a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a22.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  a22.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  a22.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  out = (OutputFile)0x0;
  uStack_407 = 0x3fc000;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&a23,(float *)&out);
  out = (OutputFile)0x0;
  uStack_407 = 0xbfc000;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&a23,(float *)&out);
  out = (OutputFile)0x0;
  uStack_407 = 0x417000;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&a23,(float *)&out);
  _out = 0x43160000;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&a23,(float *)&out);
  a24.magic = 0x2a;
  _out = (pointer)0x0;
  Imf_3_4::Header::Header(&hdr,0xd9,0xc5,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::TypedAttribute((Box *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198e16);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::TypedAttribute((Box *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198ea9);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>> *)&out);
  Imf_3_4::TypedAttribute<float>::TypedAttribute((float *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198ee2);
  Imf_3_4::TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)&out);
  Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198f19);
  Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::TypedAttribute((Matrix33 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198f51);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<float>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute((Matrix44 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198f89);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)&out);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198fc3);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::TypedAttribute((Vec2 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x198ffa);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<int>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute((Vec2 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199031);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<float>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::TypedAttribute((Vec3 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199069);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<int>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::TypedAttribute((Vec3 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1990a2);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<float>> *)&out);
  Imf_3_4::TypedAttribute<double>::TypedAttribute((double *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1990de);
  Imf_3_4::TypedAttribute<double>::~TypedAttribute((TypedAttribute<double> *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute((Chromaticities *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"a13");
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Chromaticities> *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::TypedAttribute((Envmap *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199258);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::~TypedAttribute((TypedAttribute<Imf_3_4::Envmap> *)&out)
  ;
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"a15");
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>::TypedAttribute((Matrix33 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199406);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<double>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>::TypedAttribute((Matrix44 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199440);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<double>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>::TypedAttribute((Vec2 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199479);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<double>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>::TypedAttribute((Vec3 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1994b2);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<double>> *)&out);
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1994f4);
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>::TypedAttribute((DeepImageState *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199538);
  Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::DeepImageState> *)&out);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x199579);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::~TypedAttribute
            ((TypedAttribute<std::vector<float,std::allocator<float>>> *)&out);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1995ba);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::~TypedAttribute
            ((TypedAttribute<std::vector<float,std::allocator<float>>> *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::TestOpaque>::TypedAttribute
            ((TypedAttribute<Imf_3_4::TestOpaque> *)&out,&a24);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"a24");
  Imf_3_4::Attribute::~Attribute((Attribute *)&out);
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1a5fb2);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)pf._data,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5fb2);
  std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::flush();
  remove(__filename._M_p);
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar41);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
  Imf_3_4::OutputFile::writePixels((int)&out);
  Imf_3_4::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  Imf_3_4::Header::~Header(&hdr);
  Imf_3_4::TypedAttribute<Imf_3_4::TestOpaque>::unRegisterAttributeType();
  std::operator<<((ostream *)&std::cout," reading");
  std::ostream::flush();
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&hdr,__filename._M_p,iVar41);
  poVar8 = std::operator<<((ostream *)&std::cout," (version ");
  iVar41 = Imf_3_4::InputFile::version();
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar41);
  std::operator<<(poVar8,")");
  std::ostream::flush();
  pHVar10 = (Header *)Imf_3_4::InputFile::header();
  pTVar11 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>>
                      (pHVar10,"a1");
  bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)(pTVar11 + 8),&local_c8);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<Box2iAttribute> (\"a1\").value () == a1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xe8,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar12 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>>
                      (pHVar10,"a2");
  bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<float>_>::operator==
                    ((Box<Imath_3_2::Vec2<float>_> *)(pTVar12 + 8),&local_d8);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<Box2fAttribute> (\"a2\").value () == a2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xe9,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar13 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<float>>(pHVar10,"a3");
  if ((*(float *)(pTVar13 + 8) != 3.14159) || (NAN(*(float *)(pTVar13 + 8)))) {
    __assert_fail("hdr.typedAttribute<FloatAttribute> (\"a3\").value () == a3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xea,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar14 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>(pHVar10,"a4");
  if (*(int *)(pTVar14 + 8) != 0x11) {
    __assert_fail("hdr.typedAttribute<IntAttribute> (\"a4\").value () == a4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xeb,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar15 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>>
                      (pHVar10,"a5");
  bVar5 = Imath_3_2::Matrix33<float>::operator==((Matrix33<float> *)(pTVar15 + 8),&local_48);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<M33fAttribute> (\"a5\").value () == a5",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xec,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar16 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                      (pHVar10,"a6");
  bVar5 = Imath_3_2::Matrix44<float>::operator==
                    ((Matrix44<float> *)(pTVar16 + 8),(Matrix44<float> *)&last);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<M44fAttribute> (\"a6\").value () == a6",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xed,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar17 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>
                      (pHVar10,"a7");
  _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (pTVar17 + 8),&a7);
  if (!_Var6) {
    __assert_fail("hdr.typedAttribute<StringAttribute> (\"a7\").value () == a7",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xee,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar18 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                      (pHVar10,"a8");
  iVar41 = -(uint)((int)*(undefined8 *)(pTVar18 + 8) == 0x1b);
  iVar42 = -(uint)((int)((ulong)*(undefined8 *)(pTVar18 + 8) >> 0x20) == 0x1c);
  auVar44._4_4_ = iVar41;
  auVar44._0_4_ = iVar41;
  auVar44._8_4_ = iVar42;
  auVar44._12_4_ = iVar42;
  iVar41 = movmskpd((int)pTVar18,auVar44);
  if (iVar41 != 3) {
    __assert_fail("hdr.typedAttribute<V2iAttribute> (\"a8\").value () == a8",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xef,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar19 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>>
                      (pHVar10,"a9");
  if ((((*(float *)(pTVar19 + 8) != 27.5) || (NAN(*(float *)(pTVar19 + 8)))) ||
      (*(float *)(pTVar19 + 0xc) != 28.5)) || (NAN(*(float *)(pTVar19 + 0xc)))) {
    __assert_fail("hdr.typedAttribute<V2fAttribute> (\"a9\").value () == a9",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xf0,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar20 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>>
                      (pHVar10,"a10");
  if (((*(int *)(pTVar20 + 8) != 0x25) || (*(int *)(pTVar20 + 0xc) != 0x26)) ||
     (*(int *)(pTVar20 + 0x10) != 0x27)) {
    __assert_fail("hdr.typedAttribute<V3iAttribute> (\"a10\").value () == a10",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xf1,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar21 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>>
                      (pHVar10,"a11");
  if (((*(float *)(pTVar21 + 8) != 37.5) || (NAN(*(float *)(pTVar21 + 8)))) ||
     ((*(float *)(pTVar21 + 0xc) != 38.5 ||
      (((NAN(*(float *)(pTVar21 + 0xc)) || (*(float *)(pTVar21 + 0x10) != 39.5)) ||
       (NAN(*(float *)(pTVar21 + 0x10)))))))) {
    __assert_fail("hdr.typedAttribute<V3fAttribute> (\"a11\").value () == a11",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xf2,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar22 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<double>>(pHVar10,"a12");
  if ((*(double *)(pTVar22 + 8) != 7.12342341419) || (NAN(*(double *)(pTVar22 + 8)))) {
    __assert_fail("hdr.typedAttribute<DoubleAttribute> (\"a12\").value () == a12",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xf3,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar23 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                      (pHVar10,"a13");
  if (((*(float *)(pTVar23 + 8) != _a13) || (NAN(*(float *)(pTVar23 + 8)) || NAN(_a13))) ||
     ((*(float *)(pTVar23 + 0xc) != local_17c || (NAN(*(float *)(pTVar23 + 0xc)) || NAN(local_17c)))
     )) {
    __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\").value ().red == a13.red",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xf7,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar23 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                      (pHVar10,"a13");
  if ((((*(float *)(pTVar23 + 0x10) != local_178) ||
       (NAN(*(float *)(pTVar23 + 0x10)) || NAN(local_178))) ||
      (*(float *)(pTVar23 + 0x14) != local_174)) ||
     (NAN(*(float *)(pTVar23 + 0x14)) || NAN(local_174))) {
    __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\") .value () .green == a13.green"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xfc,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar23 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                      (pHVar10,"a13");
  if (((*(float *)(pTVar23 + 0x18) != local_170) ||
      (NAN(*(float *)(pTVar23 + 0x18)) || NAN(local_170))) ||
     ((*(float *)(pTVar23 + 0x1c) != local_16c ||
      (NAN(*(float *)(pTVar23 + 0x1c)) || NAN(local_16c))))) {
    __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\").value ().blue == a13.blue",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x100,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar23 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                      (pHVar10,"a13");
  if (((*(float *)(pTVar23 + 0x20) != local_168) ||
      (NAN(*(float *)(pTVar23 + 0x20)) || NAN(local_168))) ||
     ((*(float *)(pTVar23 + 0x24) != local_164 ||
      (NAN(*(float *)(pTVar23 + 0x24)) || NAN(local_164))))) {
    __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\") .value () .white == a13.white"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x105,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar24 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Envmap>>(pHVar10,"a14")
  ;
  if (*(int *)(pTVar24 + 8) != 1) {
    __assert_fail("hdr.typedAttribute<EnvmapAttribute> (\"a14\").value () == a14",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x107,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar25 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (pHVar10,"a15");
  if (*(long *)(pTVar25 + 0x10) - *(long *)(pTVar25 + 8) != 0x80) {
    __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\") .value () .size () == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar25 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (pHVar10,"a15");
  bVar5 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (pTVar25 + 8),"who can spin");
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[0] == \"who can spin\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x110,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar25 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (pHVar10,"a15");
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)(pTVar25 + 8) + 0x20),"");
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[1] == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x114,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar25 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (pHVar10,"a15");
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)(pTVar25 + 8) + 0x40),"straw into");
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[2] == \"straw into\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x118,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar25 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (pHVar10,"a15");
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)(pTVar25 + 8) + 0x60),"gold");
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[3] == \"gold\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x11c,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar26 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>>
                      (pHVar10,"a16");
  bVar5 = Imath_3_2::Matrix33<double>::operator==
                    ((Matrix33<double> *)(pTVar26 + 8),(Matrix33<double> *)&first);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<M33dAttribute> (\"a16\").value () == a16",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x11e,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar27 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>>
                      (pHVar10,"a17");
  bVar5 = Imath_3_2::Matrix44<double>::operator==
                    ((Matrix44<double> *)(pTVar27 + 8),(Matrix44<double> *)&channels);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<M44dAttribute> (\"a17\").value () == a17",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x11f,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar28 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>>
                      (pHVar10,"a18");
  if ((((*(double *)(pTVar28 + 8) != 27.51) || (NAN(*(double *)(pTVar28 + 8)))) ||
      (*(double *)(pTVar28 + 0x10) != 28.51)) || (NAN(*(double *)(pTVar28 + 0x10)))) {
    __assert_fail("hdr.typedAttribute<V2dAttribute> (\"a18\").value () == a18",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x120,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar29 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>>
                      (pHVar10,"a19");
  if (((*(double *)(pTVar29 + 8) != 37.51) || (NAN(*(double *)(pTVar29 + 8)))) ||
     (((*(double *)(pTVar29 + 0x10) != 38.51 ||
       ((NAN(*(double *)(pTVar29 + 0x10)) || (*(double *)(pTVar29 + 0x18) != 39.51)))) ||
      (NAN(*(double *)(pTVar29 + 0x18)))))) {
    __assert_fail("hdr.typedAttribute<V3dAttribute> (\"a19\").value () == a19",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x121,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar25 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (pHVar10,"a20");
  bVar5 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(pTVar25 + 8),&a20);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a20\").value () == a20",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x124,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar30 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>>
                      (pHVar10,"a21");
  if (*(int *)(pTVar30 + 8) != 3) {
    __assert_fail("hdr.typedAttribute<DeepImageStateAttribute> (\"a21\").value () == a21",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x128,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar31 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>>
                      (pHVar10,"a22");
  bVar5 = std::operator==((vector<float,_std::allocator<float>_> *)(pTVar31 + 8),&a22);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<FloatVectorAttribute> (\"a22\").value () == a22",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,299,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar31 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>>
                      (pHVar10,"a23");
  bVar5 = std::operator==((vector<float,_std::allocator<float>_> *)(pTVar31 + 8),&a23);
  if (!bVar5) {
    __assert_fail("hdr.typedAttribute<FloatVectorAttribute> (\"a23\").value () == a23",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x12e,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  plVar32 = (long *)Imf_3_4::Header::operator[]((char *)pHVar10);
  pOVar33 = (OpaqueAttribute *)
            __dynamic_cast(plVar32,&Imf_3_4::Attribute::typeinfo,&Imf_3_4::OpaqueAttribute::typeinfo
                           ,0);
  if (pOVar33 == (OpaqueAttribute *)0x0) {
    __assert_fail("oa",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x136,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pcVar9 = (char *)(**(code **)(*plVar32 + 0x10))(plVar32);
  iVar41 = strcmp(pcVar9,"testOpaque");
  if (iVar41 != 0) {
    __assert_fail("!strcmp (a.typeName (), \"testOpaque\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x137,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  Imf_3_4::OpaqueAttribute::OpaqueAttribute((OpaqueAttribute *)&out,pOVar33);
  pcVar9 = (char *)Imf_3_4::OpaqueAttribute::typeName();
  pcVar34 = (char *)(**(code **)(*plVar32 + 0x10))(plVar32);
  iVar41 = strcmp(pcVar9,pcVar34);
  if (iVar41 != 0) {
    __assert_fail("!strcmp (b.typeName (), a.typeName ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x13b,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  if (local_3e0 != *(uint *)(pOVar33 + 0x28)) {
    __assert_fail("b.dataSize () == oa->dataSize ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x13c,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  uVar39 = 0;
  uVar40 = (ulong)local_3e0;
  if ((int)local_3e0 < 1) {
    uVar40 = uVar39;
  }
  while (uVar40 != uVar39) {
    pcVar9 = (char *)(local_3d0 + uVar39);
    pcVar34 = (char *)(*(long *)(pOVar33 + 0x38) + uVar39);
    uVar39 = uVar39 + 1;
    if (*pcVar9 != *pcVar34) {
      __assert_fail("b.data ()[i] == oa->data ()[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                    ,0x13e,
                    "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                   );
    }
  }
  Imf_3_4::OpaqueAttribute::~OpaqueAttribute((OpaqueAttribute *)&out);
  Imf_3_4::InputFile::~InputFile((InputFile *)&hdr);
  remove(__filename._M_p);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&a23.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&a22.super__Vector_base<float,_std::allocator<float>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&a20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&a15);
  std::__cxx11::string::~string((string *)&a7);
  poVar8 = std::operator<<((ostream *)&std::cout,"channel list");
  std::endl<char,std::char_traits<char>>(poVar8);
  p_Var1 = &channels._map._M_t._M_impl.super__Rb_tree_header;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       channels._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"b0");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"b1");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"b2");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"d3");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"e4");
  first._i._M_node = (iterator)(_Base_ptr)0x0;
  last._i._M_node = (iterator)(_Base_ptr)0x0;
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)0x1a9770,&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x159,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x15a,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)0x19f1a8,&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  IVar3 = first;
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x15d,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node == last._i._M_node) {
    __assert_fail("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x15e,"void (anonymous namespace)::channelList()");
  }
  first._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)first._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"b0");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar3._i._M_node + 0x20),(Name *)&out);
  IVar2 = first;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"b0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x15f,"void (anonymous namespace)::channelList()");
  }
  first._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)first._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"b1");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  IVar2 = first;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"b1\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x160,"void (anonymous namespace)::channelList()");
  }
  first._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)first._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"b2");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"b2\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x161,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x162,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)"b1",&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  IVar3 = first;
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x165,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node == last._i._M_node) {
    __assert_fail("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x166,"void (anonymous namespace)::channelList()");
  }
  first._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)first._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"b1");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar3._i._M_node + 0x20),(Name *)&out);
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"b1\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x167,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x168,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)"b11",&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x16b,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x16c,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)0x19b211,&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x16f,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x170,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)0x198739,&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  IVar3 = first;
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x173,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node == last._i._M_node) {
    __assert_fail("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x174,"void (anonymous namespace)::channelList()");
  }
  first._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)first._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"d3");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar3._i._M_node + 0x20),(Name *)&out);
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"d3\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x175,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x176,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)0x1a245f,&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  IVar3 = first;
  if (IVar2._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x179,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node == last._i._M_node) {
    __assert_fail("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x17a,"void (anonymous namespace)::channelList()");
  }
  first._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)first._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"e4");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar3._i._M_node + 0x20),(Name *)&out);
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"e4\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x17b,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x17c,"void (anonymous namespace)::channelList()");
  }
  Imf_3_4::ChannelList::channelsWithPrefix((char *)&channels,(Iterator *)0x1a08ec,&first);
  IVar2 = first;
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  if (IVar2._i._M_node != (iterator)iVar35._M_node) {
    __assert_fail("first == channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x17f,"void (anonymous namespace)::channelList()");
  }
  if (first._i._M_node != last._i._M_node) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x180,"void (anonymous namespace)::channelList()");
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
               *)&channels);
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       channels._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)0x1a9770);
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)0x1a976f);
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"a.");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)0x1997d4);
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)0x1997e7);
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)0x1997fa);
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer1.sublayer1.AA");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer1.sublayer1.R");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer1.sublayer1.G");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer1.sublayer1.B");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer1.sublayer2.R");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)0x19980d);
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer2.G");
  Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&channels,(Channel *)"layer2.B");
  dStack_450 = (double)((ulong)dStack_450 & 0xffffffff00000000);
  local_448 = (_Base_ptr)0x0;
  dStack_430 = 0.0;
  p_Stack_440 = (_Rb_tree_node_base *)&dStack_450;
  local_438 = (_Rb_tree_node_base *)&dStack_450;
  Imf_3_4::ChannelList::layers((set *)&channels);
  p_Var4 = p_Stack_440;
  p_Var36 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Stack_440);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var4 + 1),"layer1");
  if (!bVar5) {
    __assert_fail("*i++ == \"layer1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x19f,"void (anonymous namespace)::channelList()");
  }
  p_Var37 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var36);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var36 + 1),"layer1.sublayer1");
  if (!bVar5) {
    __assert_fail("*i++ == \"layer1.sublayer1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1a0,"void (anonymous namespace)::channelList()");
  }
  p_Var36 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var37);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var37 + 1),"layer1.sublayer2");
  if (!bVar5) {
    __assert_fail("*i++ == \"layer1.sublayer2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1a1,"void (anonymous namespace)::channelList()");
  }
  p_Var37 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var36);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var36 + 1),"layer2");
  if (!bVar5) {
    __assert_fail("*i++ == \"layer2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1a2,"void (anonymous namespace)::channelList()");
  }
  if (p_Var37 != (_Rb_tree_node_base *)&dStack_450) {
    __assert_fail("i == layerNames.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1a3,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)(_Base_ptr)0x0;
  _hdr = (_Base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"layer1.sublayer1",(allocator<char> *)&fb);
  Imf_3_4::ChannelList::channelsInLayer
            ((string *)&channels,(ConstIterator *)&out,(ConstIterator *)&last);
  std::__cxx11::string::~string((string *)&out);
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  IVar2 = last;
  if (last._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1a8,"void (anonymous namespace)::channelList()");
  }
  if (last._i._M_node == (iterator)_hdr) {
    __assert_fail("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1a9,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer1.sublayer1.AA");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  IVar2 = last;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer1.sublayer1.AA\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1aa,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer1.sublayer1.B");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  IVar2 = last;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer1.sublayer1.B\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1ab,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer1.sublayer1.G");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  IVar2 = last;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer1.sublayer1.G\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1ac,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer1.sublayer1.R");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer1.sublayer1.R\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1ad,"void (anonymous namespace)::channelList()");
  }
  if (last._i._M_node != (iterator)_hdr) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1ae,"void (anonymous namespace)::channelList()");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&out,"layer2",(allocator<char> *)&fb)
  ;
  Imf_3_4::ChannelList::channelsInLayer
            ((string *)&channels,(ConstIterator *)&out,(ConstIterator *)&last);
  std::__cxx11::string::~string((string *)&out);
  iVar35._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
  IVar2 = last;
  if (last._i._M_node == (iterator)iVar35._M_node) {
    __assert_fail("first != channels.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1b1,"void (anonymous namespace)::channelList()");
  }
  if (last._i._M_node == (iterator)_hdr) {
    __assert_fail("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1b2,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer2.B");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  IVar2 = last;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer2.B\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1b3,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer2.G");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  IVar2 = last;
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer2.G\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1b4,"void (anonymous namespace)::channelList()");
  }
  last._i._M_node = (iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)last._i._M_node);
  Imf_3_4::Name::Name((Name *)&out,"layer2.R");
  bVar5 = Imf_3_4::operator==((char *)((long)IVar2._i._M_node + 0x20),(Name *)&out);
  if (!bVar5) {
    __assert_fail("first++.name () == Name (\"layer2.R\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1b5,"void (anonymous namespace)::channelList()");
  }
  if (last._i._M_node != (iterator)_hdr) {
    __assert_fail("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1b6,"void (anonymous namespace)::channelList()");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&first);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
               *)&channels);
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       channels._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)pf._data,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&channels,(Slice *)0x1a5fb2);
  poVar8 = std::operator<<((ostream *)&std::cout,"only short names");
  std::endl<char,std::char_traits<char>>(poVar8);
  first._i._M_node = (iterator)(_Base_ptr)0x0;
  Imf_3_4::Header::Header
            ((Header *)&out,0xd9,0xc5,1.0,(Vec2 *)&first,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&first,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1a5fb2);
  std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::flush();
  remove(filename._M_dataplus._M_p);
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile
            ((OutputFile *)&first,filename._M_dataplus._M_p,(Header *)&out,iVar41);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&first);
  iVar42 = (int)&first;
  Imf_3_4::OutputFile::writePixels(iVar42);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&first);
  Imf_3_4::Header::~Header((Header *)&out);
  poVar8 = std::operator<<((ostream *)&std::cout," reading");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar41);
  uVar7 = Imf_3_4::InputFile::version();
  if ((uVar7 >> 10 & 1) != 0) {
    __assert_fail("!(in.version () & LONG_NAMES_FLAG)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x1e9,
                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                 );
  }
  Imf_3_4::InputFile::~InputFile((InputFile *)&out);
  poVar8 = std::operator<<((ostream *)&std::cout,"long attribute name");
  std::endl<char,std::char_traits<char>>(poVar8);
  first._i._M_node = (iterator)(_Base_ptr)0x0;
  Imf_3_4::Header::Header
            ((Header *)&out,0xd9,0xc5,1.0,(Vec2 *)&first,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::__cxx11::string::string<std::allocator<char>>((string *)&last,"y",(allocator<char> *)&hdr);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)&first);
  Imf_3_4::Header::insert((char *)&out,(Attribute *)"x2345678901234567890123456789012");
  Imf_3_4::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)&first);
  std::__cxx11::string::~string((string *)&last);
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&first,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1a5fb2);
  std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::flush();
  remove(filename._M_dataplus._M_p);
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile
            ((OutputFile *)&first,filename._M_dataplus._M_p,(Header *)&out,iVar41);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&first);
  Imf_3_4::OutputFile::writePixels(iVar42);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&first);
  Imf_3_4::Header::~Header((Header *)&out);
  poVar8 = std::operator<<((ostream *)&std::cout," reading");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar41);
  uVar7 = Imf_3_4::InputFile::version();
  if ((uVar7 >> 10 & 1) != 0) {
    pHVar10 = (Header *)Imf_3_4::InputFile::header();
    pTVar17 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>
                        (pHVar10,"x2345678901234567890123456789012");
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (pTVar17 + 8),"y");
    if (!bVar5) {
      __assert_fail("hdr.typedAttribute<StringAttribute> (longName).value () == \"y\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                    ,0x20b,
                    "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                   );
    }
    Imf_3_4::InputFile::~InputFile((InputFile *)&out);
    poVar8 = std::operator<<((ostream *)&std::cout,"long channel name");
    std::endl<char,std::char_traits<char>>(poVar8);
    first._i._M_node = (iterator)(_Base_ptr)0x0;
    Imf_3_4::Header::Header
              ((Header *)&out,0xd9,0xc5,1.0,(Vec2 *)&first,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pcVar9 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&first,FLOAT,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar9,(Channel *)"x2345678901234567890123456789012");
    std::operator<<((ostream *)&std::cout,"writing");
    std::ostream::flush();
    remove(filename._M_dataplus._M_p);
    iVar41 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile
              ((OutputFile *)&first,filename._M_dataplus._M_p,(Header *)&out,iVar41);
    Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&first);
    Imf_3_4::OutputFile::writePixels(iVar42);
    Imf_3_4::OutputFile::~OutputFile((OutputFile *)&first);
    Imf_3_4::Header::~Header((Header *)&out);
    poVar8 = std::operator<<((ostream *)&std::cout," reading");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar41 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar41);
    uVar7 = Imf_3_4::InputFile::version();
    if ((uVar7 >> 10 & 1) != 0) {
      Imf_3_4::InputFile::header();
      pcVar9 = (char *)Imf_3_4::Header::channels();
      lVar43 = Imf_3_4::ChannelList::findChannel(pcVar9);
      if (lVar43 != 0) {
        Imf_3_4::InputFile::~InputFile((InputFile *)&out);
        remove(filename._M_dataplus._M_p);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&channels);
        _out = (pointer)0x0;
        Imf_3_4::TypedAttribute<int>::TypedAttribute((TypedAttribute<int> *)&out);
        print_type<int>((TypedAttribute<int> *)&out);
        Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&out);
        poVar8 = std::operator<<((ostream *)&std::cout,"ok\n");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&filename);
        Imf_3_4::Array2D<float>::~Array2D(&pf);
        return;
      }
      __assert_fail("hdr.channels ().findChannel (longName)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                    ,0x22a,
                    "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                   );
    }
    __assert_fail("in.version () & LONG_NAMES_FLAG",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0x227,
                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                 );
  }
  __assert_fail("in.version () & LONG_NAMES_FLAG",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                ,0x208,
                "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
               );
}

Assistant:

void
testAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing built-in attributes" << endl;

        const int W = 217;
        const int H = 197;

        Array2D<float> pf (H, W);
        fillPixels (pf, W, H);

        std::string filename = tempDir + "imf_test_attr.exr";

        writeReadAttr (pf, filename.c_str (), W, H);
        channelList ();
        longNames (pf, filename.c_str (), W, H);

        print_type (OPENEXR_IMF_NAMESPACE::TypedAttribute<int> ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}